

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O1

uint8_t * av1_get_compound_type_mask(INTERINTER_COMPOUND_DATA *comp_data,BLOCK_SIZE sb_type)

{
  if (comp_data->type == '\x02') {
    comp_data = (INTERINTER_COMPOUND_DATA *)
                (av1_wedge_params_lookup[sb_type].masks[comp_data->wedge_sign] +
                comp_data->wedge_index);
  }
  return comp_data->seg_mask;
}

Assistant:

const uint8_t *av1_get_compound_type_mask(
    const INTERINTER_COMPOUND_DATA *const comp_data, BLOCK_SIZE sb_type) {
  (void)sb_type;
  switch (comp_data->type) {
    case COMPOUND_WEDGE:
      return av1_get_contiguous_soft_mask(comp_data->wedge_index,
                                          comp_data->wedge_sign, sb_type);
    default: return comp_data->seg_mask;
  }
}